

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_CrouchMove(player_t *player,int direction)

{
  double dVar1;
  double dVar2;
  APlayerPawn *pAVar3;
  bool bVar4;
  AActor *pAVar5;
  double dVar6;
  double dVar7;
  DVector2 local_28;
  
  pAVar5 = AActor::GetDefault(&player->mo->super_AActor);
  pAVar3 = player->mo;
  dVar1 = (pAVar3->super_AActor).Height;
  dVar2 = player->viewheight;
  dVar6 = player->crouchfactor + (double)direction * 0.08333333333333333;
  dVar7 = pAVar5->Height;
  player->crouchdir = (SBYTE)direction;
  player->crouchfactor = dVar6;
  (pAVar3->super_AActor).Height = dVar7 * dVar6;
  local_28.X = (pAVar3->super_AActor).__Pos.X;
  local_28.Y = (pAVar3->super_AActor).__Pos.Y;
  bVar4 = P_TryMove(&pAVar3->super_AActor,&local_28,0,(secplane_t *)0x0);
  pAVar3 = player->mo;
  if ((bVar4) || ((pAVar3->super_AActor).Height = dVar1, direction < 1)) {
    (pAVar3->super_AActor).Height = dVar1;
    dVar1 = player->crouchfactor;
    dVar7 = 1.0;
    if (dVar1 <= 1.0) {
      dVar7 = dVar1;
    }
    dVar7 = (double)(~-(ulong)(0.5 < dVar1) & 0x3fe0000000000000 |
                    (ulong)dVar7 & -(ulong)(0.5 < dVar1));
    player->crouchfactor = dVar7;
    dVar1 = pAVar3->ViewHeight;
    dVar7 = dVar7 * dVar1;
    player->viewheight = dVar7;
    player->crouchviewdelta = dVar7 - dVar1;
    P_CheckFakeFloorTriggers(&pAVar3->super_AActor,dVar2 + (pAVar3->super_AActor).__Pos.Z,true);
  }
  else {
    player->crouchfactor = player->crouchfactor - (double)direction * 0.08333333333333333;
  }
  return;
}

Assistant:

void P_CrouchMove(player_t * player, int direction)
{
	double defaultheight = player->mo->GetDefault()->Height;
	double savedheight = player->mo->Height;
	double crouchspeed = direction * CROUCHSPEED;
	double oldheight = player->viewheight;

	player->crouchdir = (signed char) direction;
	player->crouchfactor += crouchspeed;

	// check whether the move is ok
	player->mo->Height  = defaultheight * player->crouchfactor;
	if (!P_TryMove(player->mo, player->mo->Pos(), false, NULL))
	{
		player->mo->Height = savedheight;
		if (direction > 0)
		{
			// doesn't fit
			player->crouchfactor -= crouchspeed;
			return;
		}
	}
	player->mo->Height = savedheight;

	player->crouchfactor = clamp(player->crouchfactor, 0.5, 1.);
	player->viewheight = player->mo->ViewHeight * player->crouchfactor;
	player->crouchviewdelta = player->viewheight - player->mo->ViewHeight;

	// Check for eyes going above/below fake floor due to crouching motion.
	P_CheckFakeFloorTriggers(player->mo, player->mo->Z() + oldheight, true);
}